

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O2

unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
 __thiscall anon_unknown.dwarf_201151b::SHDescriptor::Clone(SHDescriptor *this)

{
  _Head_base<0UL,_(anonymous_namespace)::DescriptorImpl_*,_false> _Var1;
  const_reference pvVar2;
  pointer *__ptr;
  size_type in_RSI;
  long in_FS_OFFSET;
  long *local_28;
  _Head_base<0UL,_(anonymous_namespace)::DescriptorImpl_*,_false> local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pvVar2 = std::
           vector<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
           ::at((vector<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
                 *)(in_RSI + 0x40),in_RSI);
  (*(((pvVar2->_M_t).
      super___uniq_ptr_impl<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
      ._M_t.
      super__Tuple_impl<0UL,_(anonymous_namespace)::DescriptorImpl_*,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
      .super__Head_base<0UL,_(anonymous_namespace)::DescriptorImpl_*,_false>._M_head_impl)->
    super_Descriptor)._vptr_Descriptor[0x15])(&local_28);
  std::
  make_unique<(anonymous_namespace)::SHDescriptor,std::unique_ptr<(anonymous_namespace)::DescriptorImpl,std::default_delete<(anonymous_namespace)::DescriptorImpl>>>
            ((unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
              *)&local_20);
  _Var1._M_head_impl = local_20._M_head_impl;
  local_20._M_head_impl = (DescriptorImpl *)0x0;
  (this->super_DescriptorImpl).super_Descriptor._vptr_Descriptor = (_func_int **)_Var1._M_head_impl;
  std::
  unique_ptr<(anonymous_namespace)::SHDescriptor,_std::default_delete<(anonymous_namespace)::SHDescriptor>_>
  ::~unique_ptr((unique_ptr<(anonymous_namespace)::SHDescriptor,_std::default_delete<(anonymous_namespace)::SHDescriptor>_>
                 *)&local_20);
  if (local_28 != (long *)0x0) {
    (**(code **)(*local_28 + 8))();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (__uniq_ptr_data<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>,_true,_true>
            )(__uniq_ptr_data<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>,_true,_true>
              )this;
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<DescriptorImpl> Clone() const override
    {
        return std::make_unique<SHDescriptor>(m_subdescriptor_args.at(0)->Clone());
    }